

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_size
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  String *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  LayoutBindingTestResult *pLVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  bool *pbVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool local_4ba;
  String local_4b0;
  ulong local_490;
  String local_488;
  uint local_468;
  allocator<char> local_462;
  allocator<char> local_461;
  LayoutBindingTestResult *local_460;
  StringVector list;
  long *local_428 [2];
  long local_418 [2];
  IProgramContextSupplier *local_408;
  code *local_400;
  uint *local_3f8;
  String local_3f0;
  long *local_3d0 [2];
  long local_3c0 [2];
  String local_3b0;
  String decl;
  vector<int,_std::allocator<int>_> arraySizes;
  String local_358;
  StringIntMap bindingPoints;
  ios_base local_2c8 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x21])(this);
  makeSparseRange(&arraySizes,this,iVar6,1);
  local_4ba = true;
  bVar17 = arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start <
           arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (bVar17) {
    local_408 = &this->super_IProgramContextSupplier;
    pSVar1 = &__return_storage_ptr__->m_reason;
    local_400 = glUniformMatrix3x2fv;
    local_4ba = true;
    paVar2 = &(__return_storage_ptr__->m_reason).field_2;
    puVar10 = (uint *)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    local_460 = __return_storage_ptr__;
    do {
      paVar15 = &local_488.field_2;
      local_490 = (ulong)*puVar10;
      local_3f8 = puVar10;
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,*(char **)CONCAT44(extraout_var,iVar6),&local_461);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&bindingPoints,this,(ulong)(iVar6 + ~(uint)local_490));
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,*(char **)(CONCAT44(extraout_var_00,iVar6) + 0x18),&local_462)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&list,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_4b0,this,&list);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_3d0,this,0)
      ;
      local_428[0] = local_418;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_3b0,this,local_3d0,(string *)local_428);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_3f0,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                (&local_358,this,local_490);
      buildUniformDecl(&decl,this,(String *)&s,(String *)&bindingPoints,&local_488,&local_4b0,
                       &local_3b0,&local_3f0,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (local_428[0] != local_418) {
        operator_delete(local_428[0],local_418[0] + 1);
      }
      if (local_3d0[0] != local_3c0) {
        operator_delete(local_3d0[0],local_3c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != paVar15) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream !=
          (_func_int **)
          &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      std::ios_base::ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = local_400;
      s.super_ostringstream._328_8_ = 0;
      s.super_ostringstream._336_2_ = 0;
      s.super_ostringstream._360_8_ = 0;
      s.super_ostringstream._368_8_ = 0;
      s.super_ostringstream._344_8_ = 0;
      s.super_ostringstream._352_8_ = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&PTR__StringStream_02138dd0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
           &PTR__StringStream_02138df8;
      if (0 < (int)(uint)local_490) {
        uVar11 = 0;
        do {
          pbVar14 = (bool *)0x1c21d5d;
          if (uVar11 == 0) {
            pbVar14 = fixed_sample_locations_values + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&s,pbVar14,(ulong)(uVar11 != 0) * 3);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                    (&local_488,this,0,(ulong)uVar11);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                    (&bindingPoints,this,&local_488);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&s,(char *)bindingPoints._M_t._M_impl._0_8_,
                     bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
          if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
              &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                            (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p != paVar15) {
            operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
          }
          uVar11 = uVar11 + 1;
        } while ((uint)local_490 != uVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,";\n",2);
      std::__cxx11::stringbuf::str();
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",(String *)&bindingPoints);
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      updateTemplate(this,(this->m_stage).type);
      iVar6 = (*local_408->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar6);
      bVar5 = LayoutBindingProgram::compiledAndLinked(this_00);
      bVar18 = local_4ba != false;
      local_4ba = bVar18 && bVar5;
      if (bVar18 && bVar5) {
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < (int)(uint)local_490) {
          uVar12 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingPoints);
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                      (&local_488,this,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&bindingPoints,local_488._M_dataplus._M_p,
                       local_488._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != paVar15) {
              operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1
                             );
            }
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                      (&local_4b0,this,0);
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                      (&local_488,this,&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
              operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_488._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&bindingPoints,"_block",6);
            }
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                      (&local_4b0,this,uVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&bindingPoints,local_4b0._M_dataplus._M_p,
                       local_4b0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
              operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1
                             );
            }
            unaff_R14 = &local_4b0;
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                       unaff_R14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
              operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != paVar15) {
              operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingPoints);
            std::ios_base::~ios_base(local_2c8);
            uVar11 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar11;
          } while ((uint)local_490 != uVar11);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&list);
        (*this_00->_vptr_LayoutBindingProgram[3])
                  ((ostringstream *)&bindingPoints,this_00,&local_1c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        iVar6 = (int)local_490;
        unaff_R14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71((int7)((ulong)unaff_R14 >> 8),iVar6 < 1);
        if (0 < iVar6) {
          local_468 = (uint)unaff_R14;
          iVar6 = -iVar6;
          uVar16 = 1;
          lVar13 = 0;
          uVar12 = local_490;
          do {
            iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])
                              (this);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&bindingPoints,
                                  (key_type *)
                                  ((long)&((list.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar13));
            local_4ba = (bool)(local_4ba & iVar6 + iVar7 + -1 == *pmVar8);
            if (local_4ba == false) {
              local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4b0,"binding point did not match default","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&bindingPoints,
                                    (key_type *)
                                    ((long)&((list.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar13));
              pLVar4 = local_460;
              unaff_R14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ulong)local_468;
              iVar6 = *pmVar8;
              iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])
                                (this);
              generateLog<int,int>(&local_488,this,&local_4b0,iVar6,~(uint)uVar12 + iVar7);
              pLVar4->m_passed = false;
              pLVar4->m_notRunForThisContext = false;
              (pLVar4->m_reason)._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pSVar1,local_488._M_dataplus._M_p,
                         local_488._M_dataplus._M_p + local_488._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p != &local_488.field_2) {
                operator_delete(local_488._M_dataplus._M_p,
                                local_488.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                operator_delete(local_4b0._M_dataplus._M_p,
                                local_4b0.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00bd2a11;
            }
            uVar9 = CONCAT71((int7)((ulong)pmVar8 >> 8),local_490 <= uVar16);
            local_468 = (uint)uVar9;
            lVar13 = lVar13 + 0x20;
            iVar6 = iVar6 + 1;
            uVar16 = uVar16 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
          unaff_R14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (uVar9 & 0xffffffff);
        }
LAB_00bd2a11:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&bindingPoints._M_t);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&list);
      }
      else {
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,this_00,false);
        local_460->m_passed = false;
        local_460->m_notRunForThisContext = false;
        (local_460->m_reason)._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pSVar1,bindingPoints._M_t._M_impl._0_8_,
                   bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                   bindingPoints._M_t._M_impl._0_8_);
        if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
            &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                          (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_parent)->_M_color + 1));
        }
        unaff_R14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      (*this_00->_vptr_LayoutBindingProgram[1])();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_460;
      if (((ulong)unaff_R14 & 1) == 0) break;
      puVar10 = local_3f8 + 1;
      bVar17 = puVar10 < arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    } while (bVar17);
  }
  if (!bVar17) {
    puVar3 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
    __return_storage_ptr__->m_passed = local_4ba;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)puVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,puVar3,puVar3);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)puVar3) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
  }
  if (arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_size(void)
{
	bool passed = true;

	std::vector<int> arraySizes = makeSparseRange(maxArraySize(), 1);
	for (std::vector<int>::iterator it = arraySizes.begin(); it < arraySizes.end(); it++)
	{
		int	arraySize = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings() - arraySize - 1),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= (((maxBindings() - arraySize - 1) + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]],
																   (maxBindings() - arraySize - 1) + idx));
			}
		}
	}

	return LayoutBindingTestResult(passed, String());
}